

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QNetworkCookiePrivate>::reset
          (QSharedDataPointer<QNetworkCookiePrivate> *this,QNetworkCookiePrivate *ptr)

{
  bool bVar1;
  QNetworkCookiePrivate *pQVar2;
  QNetworkCookiePrivate *in_RSI;
  QNetworkCookiePrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkCookiePrivate *old;
  totally_ordered_wrapper<QNetworkCookiePrivate_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QNetworkCookiePrivate_*> local_18;
  totally_ordered_wrapper<QNetworkCookiePrivate_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QNetworkCookiePrivate_*>::get
                     ((totally_ordered_wrapper<QNetworkCookiePrivate_*> *)in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QNetworkCookiePrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1bf18c);
    }
    Qt::totally_ordered_wrapper<QNetworkCookiePrivate_*>::totally_ordered_wrapper(&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QNetworkCookiePrivate*>,Qt::totally_ordered_wrapper<QNetworkCookiePrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QNetworkCookiePrivate_*> *)0x1bf1aa);
    pQVar2 = Qt::totally_ordered_wrapper<QNetworkCookiePrivate_*>::get(&local_10);
    if (((pQVar2 != (QNetworkCookiePrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1bf1d0), !bVar1)) &&
       (pQVar2 != (QNetworkCookiePrivate *)0x0)) {
      QNetworkCookiePrivate::~QNetworkCookiePrivate(in_RDI);
      operator_delete(pQVar2,0x90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }